

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O0

SUNMatrix SUNSparseMatrix(sunindextype M,sunindextype N,sunindextype NNZ,int sparsetype,
                         SUNContext_conflict sunctx)

{
  SUNMatrix p_Var1;
  undefined8 *puVar2;
  void *pvVar3;
  int in_ECX;
  size_t in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_R8;
  SUNMatrixContent_Sparse content;
  SUNMatrix A;
  SUNContext_conflict sunctx_local_scope_;
  
  p_Var1 = (SUNMatrix)SUNMatNewEmpty(in_R8);
  p_Var1->ops->getid = SUNMatGetID_Sparse;
  p_Var1->ops->clone = SUNMatClone_Sparse;
  p_Var1->ops->destroy = SUNMatDestroy_Sparse;
  p_Var1->ops->zero = SUNMatZero_Sparse;
  p_Var1->ops->copy = SUNMatCopy_Sparse;
  p_Var1->ops->scaleadd = SUNMatScaleAdd_Sparse;
  p_Var1->ops->scaleaddi = SUNMatScaleAddI_Sparse;
  p_Var1->ops->matvec = SUNMatMatvec_Sparse;
  p_Var1->ops->mathermitiantransposevec = SUNMatHermitianTransposeVec_Sparse;
  p_Var1->ops->space = SUNMatSpace_Sparse;
  puVar2 = (undefined8 *)malloc(0x60);
  p_Var1->content = puVar2;
  *(int *)(puVar2 + 5) = in_ECX;
  *puVar2 = in_RDI;
  puVar2[1] = in_RSI;
  puVar2[2] = in_RDX;
  if (in_ECX == 0) {
    puVar2[3] = in_RSI;
    puVar2[8] = puVar2 + 6;
    puVar2[9] = puVar2 + 7;
    puVar2[10] = 0;
    puVar2[0xb] = 0;
  }
  else if (in_ECX == 1) {
    puVar2[3] = in_RDI;
    puVar2[10] = puVar2 + 6;
    puVar2[0xb] = puVar2 + 7;
    puVar2[8] = 0;
    puVar2[9] = 0;
  }
  puVar2[4] = 0;
  puVar2[6] = 0;
  puVar2[7] = 0;
  pvVar3 = calloc(in_RDX,8);
  puVar2[4] = pvVar3;
  pvVar3 = calloc(in_RDX,8);
  puVar2[6] = pvVar3;
  pvVar3 = calloc(puVar2[3] + 1,8);
  puVar2[7] = pvVar3;
  *(undefined8 *)(puVar2[7] + puVar2[3] * 8) = 0;
  return p_Var1;
}

Assistant:

SUNMatrix SUNSparseMatrix(sunindextype M, sunindextype N, sunindextype NNZ,
                          int sparsetype, SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);
  SUNMatrix A;
  SUNMatrixContent_Sparse content;

  /* return with NULL matrix on illegal input */
  SUNAssertNull(M > 0 && N > 0, SUN_ERR_ARG_OUTOFRANGE);
  SUNAssertNull(NNZ >= 0, SUN_ERR_ARG_OUTOFRANGE);
  SUNAssertNull(sparsetype == CSC_MAT || sparsetype == CSR_MAT,
                SUN_ERR_ARG_OUTOFRANGE);

  /* Create an empty matrix object */
  A = NULL;
  A = SUNMatNewEmpty(sunctx);
  SUNCheckLastErrNull();

  /* Attach operations */
  A->ops->getid                    = SUNMatGetID_Sparse;
  A->ops->clone                    = SUNMatClone_Sparse;
  A->ops->destroy                  = SUNMatDestroy_Sparse;
  A->ops->zero                     = SUNMatZero_Sparse;
  A->ops->copy                     = SUNMatCopy_Sparse;
  A->ops->scaleadd                 = SUNMatScaleAdd_Sparse;
  A->ops->scaleaddi                = SUNMatScaleAddI_Sparse;
  A->ops->matvec                   = SUNMatMatvec_Sparse;
  A->ops->mathermitiantransposevec = SUNMatHermitianTransposeVec_Sparse;
  A->ops->space                    = SUNMatSpace_Sparse;

  /* Create content */
  content = NULL;
  content = (SUNMatrixContent_Sparse)malloc(sizeof *content);
  SUNAssertNull(content, SUN_ERR_MALLOC_FAIL);

  /* Attach content */
  A->content = content;

  /* Fill content */
  content->sparsetype = sparsetype;
  content->M          = M;
  content->N          = N;
  content->NNZ        = NNZ;
  switch (sparsetype)
  {
  case CSC_MAT:
    content->NP      = N;
    content->rowvals = &(content->indexvals);
    content->colptrs = &(content->indexptrs);
    /* CSR indices */
    content->colvals = NULL;
    content->rowptrs = NULL;
    break;
  case CSR_MAT:
    content->NP      = M;
    content->colvals = &(content->indexvals);
    content->rowptrs = &(content->indexptrs);
    /* CSC indices */
    content->rowvals = NULL;
    content->colptrs = NULL;
  }
  content->data      = NULL;
  content->indexvals = NULL;
  content->indexptrs = NULL;

  /* Allocate content */
  content->data = (sunrealtype*)calloc(NNZ, sizeof(sunrealtype));
  SUNAssertNull(content->data, SUN_ERR_MALLOC_FAIL);

  content->indexvals = (sunindextype*)calloc(NNZ, sizeof(sunindextype));
  SUNAssertNull(content->indexvals, SUN_ERR_MALLOC_FAIL);

  content->indexptrs = (sunindextype*)calloc((content->NP + 1),
                                             sizeof(sunindextype));
  SUNAssertNull(content->indexptrs, SUN_ERR_MALLOC_FAIL);
  content->indexptrs[content->NP] = 0;

  return (A);
}